

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

int INT_CMinstall_pull_schedule
              (CManager_conflict cm,timeval *base_time,timeval *period,CMavail_period_ptr avail)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  transport_entry_conflict *pp_Var5;
  FILE *pFVar6;
  __suseconds_t _Var7;
  int iVar8;
  __pid_t _Var9;
  long lVar10;
  CMavail_period_ptr __dest;
  pthread_t pVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  transport_entry_conflict p_Var15;
  long lVar16;
  long lVar17;
  __suseconds_t *p_Var18;
  size_t __nmemb;
  bool bVar19;
  bool bVar20;
  timespec ts;
  timespec local_40;
  
  sVar13 = 0;
  __nmemb = 0;
  do {
    lVar10 = *(long *)((long)&(avail->offset).tv_sec + sVar13);
    if (lVar10 == 0) {
      lVar10 = *(long *)((long)&(avail->offset).tv_usec + sVar13);
      if (lVar10 != 0) goto LAB_00121052;
      if ((*(long *)((long)&(avail->duration).tv_sec + sVar13) == 0) &&
         (*(long *)((long)&(avail->duration).tv_usec + sVar13) == 0)) {
        __dest = (CMavail_period_ptr)INT_CMmalloc(sVar13 + 0x20 & 0x1fffffffe0);
        memcpy(__dest,avail,sVar13);
        qsort(__dest,__nmemb,0x20,offset_compare);
        if (__nmemb != 0) {
          lVar10 = period->tv_sec;
          p_Var18 = &(avail->duration).tv_usec;
          sVar13 = 0;
          lVar12 = 0;
          lVar16 = 0;
          do {
            lVar2 = p_Var18[-3];
            lVar3 = p_Var18[-2];
            lVar1 = *p_Var18 + lVar3;
            lVar17 = *p_Var18 + -1000000 + lVar3;
            if (lVar1 < 1000000) {
              lVar17 = lVar1;
            }
            lVar14 = (ulong)(999999 < lVar1) + ((timeval *)(p_Var18 + -1))->tv_sec + lVar2;
            bVar20 = SBORROW8(lVar14,lVar10);
            lVar1 = lVar14 - lVar10;
            bVar19 = lVar14 == lVar10;
            if (bVar19) {
              lVar4 = period->tv_usec;
              bVar20 = SBORROW8(lVar17,lVar4);
              lVar1 = lVar17 - lVar4;
              bVar19 = lVar17 == lVar4;
            }
            if (!bVar19 && bVar20 == lVar1 < 0) {
              fprintf(_stderr,
                      "CMinstall_pull_schedule(), avail region %d rejected, extends beyond period\n"
                     );
              free(__dest);
              return -1;
            }
            bVar19 = SBORROW8(lVar2,lVar16);
            lVar1 = lVar2 - lVar16;
            if (lVar2 == lVar16) {
              bVar19 = SBORROW8(lVar3,lVar12);
              lVar1 = lVar3 - lVar12;
            }
            if (bVar19 != lVar1 < 0) {
              INT_CMinstall_pull_schedule_cold_5();
              return -1;
            }
            sVar13 = sVar13 + 1;
            p_Var18 = p_Var18 + 4;
            lVar12 = lVar17;
            lVar16 = lVar14;
          } while (__nmemb != sVar13);
        }
        _Var7 = base_time->tv_usec;
        (cm->base_time).tv_sec = base_time->tv_sec;
        (cm->base_time).tv_usec = _Var7;
        _Var7 = period->tv_usec;
        (cm->period).tv_sec = period->tv_sec;
        (cm->period).tv_usec = _Var7;
        cm->avail = __dest;
        pp_Var5 = cm->transports;
        iVar8 = CMtrace_val[5];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar8 = CMtrace_init(cm,CMTransportVerbose);
        }
        if (iVar8 != 0) {
          if (CMtrace_PID != 0) {
            pFVar6 = (FILE *)cm->CMTrace_file;
            _Var9 = getpid();
            pVar11 = pthread_self();
            fprintf(pFVar6,"P%lxT%lx - ",(long)_Var9,pVar11);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_40);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,
                  "CM installed pull schedule with period %ld secs, %zd usecs\n",period->tv_sec,
                  period->tv_usec);
        }
        fflush((FILE *)cm->CMTrace_file);
        if (pp_Var5 != (transport_entry_conflict *)0x0) {
          p_Var15 = *pp_Var5;
          if (p_Var15 != (transport_entry_conflict)0x0) {
            do {
              if (p_Var15->install_pull_schedule_func != (CMTransport_install_pull_schedule)0x0) {
                (*p_Var15->install_pull_schedule_func)
                          (&CMstatic_trans_svcs,p_Var15,base_time,period,cm->avail);
                iVar8 = CMtrace_val[5];
                if (cm->CMTrace_file == (FILE *)0x0) {
                  iVar8 = CMtrace_init(cm,CMTransportVerbose);
                }
                if (iVar8 != 0) {
                  if (CMtrace_PID != 0) {
                    pFVar6 = (FILE *)cm->CMTrace_file;
                    _Var9 = getpid();
                    pVar11 = pthread_self();
                    fprintf(pFVar6,"P%lxT%lx - ",(long)_Var9,pVar11);
                  }
                  if (CMtrace_timing != 0) {
                    clock_gettime(1,&local_40);
                    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,
                            local_40.tv_nsec);
                  }
                  fprintf((FILE *)cm->CMTrace_file,"CM installed pull schedule to transport %s\n",
                          (*pp_Var5)->trans_name);
                }
                fflush((FILE *)cm->CMTrace_file);
              }
              p_Var15 = pp_Var5[1];
              pp_Var5 = pp_Var5 + 1;
            } while (p_Var15 != (transport_entry_conflict)0x0);
            return 0;
          }
          return 0;
        }
        return 0;
      }
    }
    else {
      if (lVar10 < 0) {
        INT_CMinstall_pull_schedule_cold_1();
        return 0;
      }
      lVar10 = *(long *)((long)&(avail->offset).tv_usec + sVar13);
LAB_00121052:
      if (lVar10 < 0) {
        INT_CMinstall_pull_schedule_cold_2();
        return 0;
      }
    }
    if (*(long *)((long)&(avail->duration).tv_sec + sVar13) < 0) {
      INT_CMinstall_pull_schedule_cold_4();
      return 0;
    }
    if (*(long *)((long)&(avail->duration).tv_usec + sVar13) < 0) {
      INT_CMinstall_pull_schedule_cold_3();
      return 0;
    }
    __nmemb = __nmemb + 1;
    sVar13 = sVar13 + 0x20;
  } while( true );
}

Assistant:

extern int
INT_CMinstall_pull_schedule(CManager cm, struct timeval *base_time, 
			    struct timeval *period, CMavail_period_ptr avail)
{
    int i = 0, count = 0;
    struct timeval zero = {0,0}, last_end = {0,0};
    CMavail_period_ptr sorted;
    while (timercmp(&avail[count].offset, &zero, !=) ||
	   timercmp(&avail[count].duration, &zero, !=)) {
	if (avail[count].offset.tv_sec < 0) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail sec offset is negative.  Rejected\n");
	    return 0;
	}
	if (avail[count].offset.tv_usec < 0) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail usec offset is negative.  Rejected\n");
	    return 0;
	}
	if (avail[count].duration.tv_sec < 0) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail sec duration is negative.  Rejected\n");
	    return 0;
	}
	if (avail[count].duration.tv_usec < 0) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail usec duration is negative.  Rejected\n");
	    return 0;
	}
	count++;
    }
    sorted = malloc(sizeof(avail[0]) * (count+1));
    memcpy(sorted, avail, sizeof(avail[0]) * count);
    qsort(sorted, count, sizeof(avail[0]), offset_compare);
    for (i = 0; i < count; i++) {
	struct timeval end;
	timeradd(&avail[i].offset, &avail[i].duration, &end);
	if (timercmp(&end, period, >)) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail region %d rejected, extends beyond period\n", i);
	    free(sorted);
	    return -1;
	}
	if (timercmp(&avail[i].offset, &last_end, <)) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail regions overlap. Rejected\n");
	    free(sorted);
	    return -1;
	}
	last_end = end;
    }

    cm->base_time = *base_time;
    cm->period = *period;
    cm->avail = sorted;
    transport_entry *trans_list;
    trans_list = cm->transports;
    CMtrace_out(cm, CMTransportVerbose, "CM installed pull schedule with period %ld secs, %zd usecs\n", period->tv_sec, (size_t) period->tv_usec);
    while ((trans_list != NULL) && (*trans_list != NULL)) {
	if ((*trans_list)->install_pull_schedule_func) {
	    (*trans_list)->install_pull_schedule_func(&CMstatic_trans_svcs,
						      *trans_list,
						      base_time, period,
						      cm->avail);
	    CMtrace_out(cm, CMTransportVerbose, "CM installed pull schedule to transport %s\n", (*trans_list)->trans_name);
	}
	trans_list++;
    }
    return 0;
}